

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall
aalcalc::calculatemeansddev<aal_rec_period>
          (aalcalc *this,aal_rec_period *record,int sample_size,int p1,int p2,int periods,
          double *mean,double *sd_dev)

{
  double dVar1;
  double s2;
  double s1;
  double mean_squared;
  int periods_local;
  int p2_local;
  int p1_local;
  int sample_size_local;
  aal_rec_period *record_local;
  aalcalc *this_local;
  
  *mean = (record->super_aal_rec).mean / (double)sample_size;
  dVar1 = sqrt(((record->super_aal_rec).mean_squared -
               ((record->super_aal_rec).mean * (record->super_aal_rec).mean) / (double)p1) /
               (double)p2);
  *sd_dev = dVar1;
  *mean = *mean / (double)periods;
  return;
}

Assistant:

inline void aalcalc::calculatemeansddev(const aal_rec_T &record,
					const int sample_size, const int p1,
					const int p2, const int periods,
					double &mean, double &sd_dev) {

	mean = record.mean / sample_size;
	double mean_squared = record.mean * record.mean;
	double s1 = record.mean_squared - mean_squared / p1;
	double s2 = s1 / p2;
	sd_dev = sqrt(s2);
	mean = mean / periods;

}